

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

bool __thiscall deqp::gls::pixelNearLineIntersection(gls *this,int x,int y,Surface *target)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar3 = (x + -1) * y + (int)this + -1;
  iVar4 = 0;
  bVar2 = true;
  iVar5 = -1;
  do {
    lVar6 = 0;
    do {
      if ((((&target->m_width)[iVar3 + (int)lVar6] & 0xffffffU) != 0) && (3 < iVar4 + 1)) {
        return bVar2;
      }
      if (((&target->m_width)[iVar3 + (int)lVar6] & 0xffffffU) != 0) {
        iVar4 = iVar4 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    iVar1 = iVar5 + 1;
    bVar2 = iVar5 < 1;
    iVar3 = iVar3 + y;
    iVar5 = iVar1;
    if (iVar1 == 2) {
      return bVar2;
    }
  } while( true );
}

Assistant:

static bool pixelNearLineIntersection (int x, int y, const tcu::Surface& target)
{
	// should not be called for edge pixels
	DE_ASSERT(x >= 1 && x <= target.getWidth()-2);
	DE_ASSERT(y >= 1 && y <= target.getHeight()-2);

	int coveredPixels = 0;

	for (int dy = -1; dy < 2; dy++)
	for (int dx = -1; dx < 2; dx++)
	{
		const bool targetCoverage = !isBlack(target.getPixel(x+dx, y+dy));
		if (targetCoverage)
		{
			++coveredPixels;

			// A single thin line cannot have more than 3 covered pixels in a 3x3 area
			if (coveredPixels >= 4)
				return true;
		}
	}

	return false;
}